

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deadlock_test.cpp
# Opt level: O0

void __thiscall
CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
::TestBody(CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
           *this)

{
  pointer pDVar1;
  bool bVar2;
  int iVar3;
  char *message;
  char *regex;
  AssertHelper local_a0;
  Message local_98;
  int local_8c;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  local_50;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_38;
  pointer local_20;
  DeathTest *gtest_dt;
  CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *pCStack_10;
  anon_class_1_0_00000001 test_body;
  CheckedMutexTest_SimultaneousDeadlock_Test<yamc::checked::basic_shared_timed_mutex<yamc::rwlock::ReaderPrefer>_>
  *this_local;
  
  pCStack_10 = this;
  bVar2 = testing::internal::AlwaysTrue();
  if (!bVar2) goto LAB_0022ce2b;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_(&local_38,(internal *)0x2ae789,regex);
  bVar2 = testing::internal::DeathTest::Create
                    ("test_body()",&local_38,
                     "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/deadlock_test.cpp"
                     ,0xb3,&local_20);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher(&local_38);
  if (((bVar2 ^ 0xffU) & 1) != 0) goto LAB_0022ce2b;
  if (local_20 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&local_50,local_20);
  iVar3 = (*local_20->_vptr_DeathTest[2])();
  pDVar1 = local_20;
  if (iVar3 == 0) {
    testing::KilledBySignal::KilledBySignal((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),6);
    iVar3 = (*local_20->_vptr_DeathTest[3])();
    bVar2 = testing::KilledBySignal::operator()
                      ((KilledBySignal *)((long)&gtest_sentinel.test_ + 4),iVar3);
    iVar3 = (*pDVar1->_vptr_DeathTest[4])(pDVar1,(ulong)bVar2);
    if ((((byte)iVar3 ^ 0xff) & 1) == 0) goto LAB_0022cdf3;
    local_8c = 2;
  }
  else {
    if (iVar3 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                ((ReturnSentinel *)&gtest_exception,local_20);
      bVar2 = testing::internal::AlwaysTrue();
      if (bVar2) {
        TestBody::anon_class_1_0_00000001::operator()
                  ((anon_class_1_0_00000001 *)((long)&gtest_dt + 7));
      }
      (*local_20->_vptr_DeathTest[5])(local_20,2);
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                ((ReturnSentinel *)&gtest_exception);
    }
LAB_0022cdf3:
    local_8c = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr(&local_50);
  if (local_8c == 0) {
    return;
  }
LAB_0022ce2b:
  testing::Message::Message(&local_98);
  message = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_a0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/yohhoy[P]yamc/tests/deadlock_test.cpp"
             ,0xb3,message);
  testing::internal::AssertHelper::operator=(&local_a0,&local_98);
  testing::internal::AssertHelper::~AssertHelper(&local_a0);
  testing::Message::~Message(&local_98);
  return;
}

Assistant:

TYPED_TEST(CheckedMutexTest, SimultaneousDeadlock)
{
  auto test_body = []{
    constexpr size_t NPAIRS = 4;
    yamc::test::barrier step(NPAIRS * 2);
    TypeParam mtx[NPAIRS * 2];
    yamc::test::task_runner(NPAIRS * 2, [&](std::size_t id) {
      TypeParam& mtx1 = mtx[id % NPAIRS];
      TypeParam& mtx2 = mtx[id % NPAIRS + NPAIRS];
      if (id < NPAIRS) {
        ASSERT_NO_THROW(mtx1.lock());
        step.await();
        EXPECT_NO_THROW(mtx2.lock());
        EXPECT_NO_THROW(mtx2.unlock());
        EXPECT_NO_THROW(mtx1.unlock());
      } else {
        ASSERT_NO_THROW(mtx2.lock());
        step.await();
        WAIT_TICKS;
        EXPECT_CHECK_FAILURE_INNER({
          mtx1.lock();
        });
        EXPECT_NO_THROW(mtx2.unlock());
      }
    });
  };
  EXPECT_CHECK_FAILURE_OUTER(test_body());
}